

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_core.cc
# Opt level: O0

void __thiscall webrtc::AecCore::AecCore(AecCore *this)

{
  AecCore *this_local;
  
  this->sampFreq = 16000;
  PowerLevel::PowerLevel(&this->farlevel);
  PowerLevel::PowerLevel(&this->nearlevel);
  PowerLevel::PowerLevel(&this->linoutlevel);
  PowerLevel::PowerLevel(&this->nlpoutlevel);
  DivergentFilterFraction::DivergentFilterFraction(&this->divergent_filter_fraction);
  return;
}

Assistant:

AecCore::AecCore() = default;